

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::MultiplyByPowerOfTen(Bignum *this,int exponent)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  if ((exponent != 0) && (this->used_digits_ != 0)) {
    iVar2 = exponent;
    iVar3 = exponent;
    if (0x1a < exponent) {
      do {
        MultiplyByUInt64(this,0x6765c793fa10079d);
        iVar2 = iVar3 + -0x1b;
        bVar1 = 0x35 < iVar3;
        iVar3 = iVar2;
      } while (bVar1);
    }
    iVar3 = iVar2;
    if (0xc < iVar2) {
      do {
        MultiplyByUInt32(this,0x48c27395);
        iVar2 = iVar3 + -0xd;
        bVar1 = 0x19 < iVar3;
        iVar3 = iVar2;
      } while (bVar1);
    }
    if (0 < iVar2) {
      MultiplyByUInt32(this,*(uint32_t *)(&DAT_003abeb0 + (ulong)(iVar2 - 1) * 4));
    }
    ShiftLeft(this,exponent);
    return;
  }
  return;
}

Assistant:

void Bignum::MultiplyByPowerOfTen(int exponent) {
  const uint64_t kFive27 = UINT64_2PART_C(0x6765c793, fa10079d);
  const uint16_t kFive1 = 5;
  const uint16_t kFive2 = kFive1 * 5;
  const uint16_t kFive3 = kFive2 * 5;
  const uint16_t kFive4 = kFive3 * 5;
  const uint16_t kFive5 = kFive4 * 5;
  const uint16_t kFive6 = kFive5 * 5;
  const uint32_t kFive7 = kFive6 * 5;
  const uint32_t kFive8 = kFive7 * 5;
  const uint32_t kFive9 = kFive8 * 5;
  const uint32_t kFive10 = kFive9 * 5;
  const uint32_t kFive11 = kFive10 * 5;
  const uint32_t kFive12 = kFive11 * 5;
  const uint32_t kFive13 = kFive12 * 5;
  const uint32_t kFive1_to_12[] =
      { kFive1, kFive2, kFive3, kFive4, kFive5, kFive6,
        kFive7, kFive8, kFive9, kFive10, kFive11, kFive12 };

  ASSERT(exponent >= 0);
  if (exponent == 0) return;
  if (used_digits_ == 0) return;

  // We shift by exponent at the end just before returning.
  int remaining_exponent = exponent;
  while (remaining_exponent >= 27) {
    MultiplyByUInt64(kFive27);
    remaining_exponent -= 27;
  }
  while (remaining_exponent >= 13) {
    MultiplyByUInt32(kFive13);
    remaining_exponent -= 13;
  }
  if (remaining_exponent > 0) {
    MultiplyByUInt32(kFive1_to_12[remaining_exponent - 1]);
  }
  ShiftLeft(exponent);
}